

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomCapsule *geom,uint32_t indent,
          bool closing_brace)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t uVar5;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t n_01;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint indent_00;
  string axis;
  stringstream ss;
  string local_208;
  string local_1e8;
  uint32_t local_1c4;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c4 = indent;
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," Capsule \"",10);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  paVar7 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar7) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  uVar5 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n_00);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar7) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
    print_prim_metas_abi_cxx11_(&local_208,this + 0x1a10,(PrimMeta *)(ulong)((int)geom + 1),indent);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    uVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar7) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),uVar5);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,")\n",2);
    uVar5 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar7) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
      uVar5 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),uVar5);
  poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar7) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"radius","");
  indent_00 = (int)geom + 1;
  print_typed_attr<double>
            (&local_208,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x2100)
             ,&local_1e8,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"height","");
  print_typed_attr<double>
            (&local_208,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x1e68)
             ,&local_1e8,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((((this[0x25c0] != (tinyusdz)0x0) || (this[0x25b8] != (tinyusdz)0x0)) ||
      (*(long *)(this + 0x25a8) != *(long *)(this + 0x25a0))) || (this[0x25c8] == (tinyusdz)0x1)) {
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    pcVar6 = "\"Z\"";
    if (*(int *)(this + (ulong)((byte)this[0x25b8] ^ 1) * 8 + 0x25bc) == 1) {
      pcVar6 = "\"Y\"";
    }
    pcVar4 = "\"X\"";
    if (*(int *)(this + (ulong)((byte)this[0x25b8] ^ 1) * 8 + 0x25bc) != 0) {
      pcVar4 = pcVar6;
    }
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    ::std::__cxx11::string::_M_replace((ulong)&local_208,0,(char *)0x0,(ulong)pcVar4);
    pprint::Indent_abi_cxx11_(&local_1e8,(pprint *)(ulong)indent_00,n_01);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"uniform token axis = ",0x15);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
  }
  paVar7 = &local_208.field_2;
  print_gprim_predefined<tinyusdz::GeomCapsule>(&local_208,(GeomCapsule *)this,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar7) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
  }
  print_props(&local_208,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  uVar5 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar7) {
    operator_delete(local_208._M_dataplus._M_p,
                    CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                             local_208.field_2._M_local_buf[0]) + 1);
    uVar5 = extraout_EDX_04;
  }
  if ((char)local_1c4 != '\0') {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),uVar5);
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar7) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                               local_208.field_2._M_local_buf[0]) + 1);
    }
  }
  psVar1 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string to_string(const GeomCapsule &geom, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(geom.spec) << " Capsule \""
     << geom.name << "\"\n";
  if (geom.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(geom.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(geom.radius, "radius", indent + 1);
  ss << print_typed_attr(geom.height, "height", indent + 1);

  if (geom.axis.authored()) {
    std::string axis;
    if (geom.axis.get_value() == Axis::X) {
      axis = "\"X\"";
    } else if (geom.axis.get_value() == Axis::Y) {
      axis = "\"Y\"";
    } else {
      axis = "\"Z\"";
    }
    ss << pprint::Indent(indent + 1) << "uniform token axis = " << axis << "\n";
  }

  ss << print_gprim_predefined(geom, indent + 1);
  ss << print_props(geom.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}